

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

double extract_spR<PredictionData<float,long>,long>
                 (PredictionData<float,_long> *prediction_data,long *row_st,long *row_end,
                 size_t col_num)

{
  size_t *psVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (row_end != row_st) {
    psVar1 = (size_t *)
             std::__lower_bound<long_const*,long,__gnu_cxx::__ops::_Iter_less_val>(row_st,row_end);
    if (psVar1 == (size_t *)row_end) {
      dVar2 = 0.0;
    }
    else {
      dVar2 = 0.0;
      if (*psVar1 == col_num) {
        dVar2 = (double)*(float *)((long)prediction_data->Xr +
                                  ((long)psVar1 - (long)prediction_data->Xr_ind >> 1));
      }
    }
  }
  return dVar2;
}

Assistant:

double extract_spR(const PredictionData &prediction_data, const sparse_ix *row_st, const sparse_ix *row_end, size_t col_num) noexcept
{
    if (row_end == row_st)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}